

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration.c
# Opt level: O0

double * inform_integration_evidence
                   (int *series,size_t l,size_t n,int *b,double *evidence,inform_error *err)

{
  _Bool _Var1;
  double *evidence_00;
  size_t *xs;
  size_t nparts_00;
  bool bVar2;
  double local_90;
  double local_88;
  ulong local_80;
  size_t i_1;
  size_t nparts;
  size_t *parts;
  size_t i;
  double *maximum;
  double *minimum;
  double *lmi;
  int allocate;
  inform_error *err_local;
  double *evidence_local;
  int *b_local;
  size_t n_local;
  size_t l_local;
  int *series_local;
  
  _Var1 = check_arguments(series,l,err);
  if (_Var1) {
    series_local = (int *)0x0;
  }
  else {
    bVar2 = evidence == (double *)0x0;
    err_local = (inform_error *)evidence;
    if ((bVar2) && (err_local = (inform_error *)malloc(n << 4), err_local == (inform_error *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      series_local = (int *)0x0;
    }
    else {
      evidence_00 = (double *)malloc(n << 3);
      if (evidence_00 == (double *)0x0) {
        if (bVar2) {
          free(err_local);
        }
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        series_local = (int *)0x0;
      }
      else {
        for (parts = (size_t *)0x0; parts < n; parts = (size_t *)((long)parts + 1)) {
          (err_local + (long)parts * 2)[0] = INFORM_SUCCESS;
          (err_local + (long)parts * 2)[1] = 0x7ff00000;
          (err_local + n * 2 + (long)parts * 2)[0] = INFORM_SUCCESS;
          (err_local + n * 2 + (long)parts * 2)[1] = 0xfff00000;
        }
        xs = inform_first_partitioning(l);
        while (nparts_00 = inform_next_partitioning(xs,l), nparts_00 != 0) {
          inform_integration_evidence_part(series,l,n,b,xs,nparts_00,evidence_00,err);
          _Var1 = inform_failed(err);
          if (_Var1) break;
          for (local_80 = 0; local_80 < n; local_80 = local_80 + 1) {
            if (evidence_00[local_80] <= *(double *)(err_local + local_80 * 2)) {
              local_88 = evidence_00[local_80];
            }
            else {
              local_88 = *(double *)(err_local + local_80 * 2);
            }
            *(double *)(err_local + local_80 * 2) = local_88;
            if (*(double *)(err_local + n * 2 + local_80 * 2) < evidence_00[local_80] ||
                *(double *)(err_local + n * 2 + local_80 * 2) == evidence_00[local_80]) {
              local_90 = evidence_00[local_80];
            }
            else {
              local_90 = *(double *)(err_local + n * 2 + local_80 * 2);
            }
            *(double *)(err_local + n * 2 + local_80 * 2) = local_90;
          }
        }
        free(xs);
        free(evidence_00);
        _Var1 = inform_failed(err);
        if (_Var1) {
          if (bVar2) {
            free(err_local);
          }
          series_local = (int *)0x0;
        }
        else {
          series_local = err_local;
        }
      }
    }
  }
  return (double *)series_local;
}

Assistant:

double *inform_integration_evidence(int const *series, size_t l, size_t n,
    int const *b, double *evidence, inform_error *err)
{
    if (check_arguments(series, l, err))
    {
        return NULL;
    }
    int allocate = (evidence == NULL);
    if (allocate)
    {
        evidence = malloc(2 * n * sizeof(double));
        if (evidence == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }
    double *lmi = malloc(n * sizeof(double));
    if (lmi == NULL)
    {
        if (allocate) free(evidence);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    double *minimum = evidence;
    double *maximum = minimum + n;
    for (size_t i = 0; i < n; ++i)
    {
        minimum[i] = INFINITY;
        maximum[i] = -INFINITY;
    }

    size_t *parts = inform_first_partitioning(l);
    size_t nparts = 1;
    while ((nparts = inform_next_partitioning(parts, l)))
    {
        inform_integration_evidence_part(series, l, n, b, parts, nparts, lmi, err);
        if (inform_failed(err))
        {
            break;
        }
        for (size_t i = 0; i < n; ++i)
        {
            minimum[i] = MIN(minimum[i], lmi[i]);
            maximum[i] = MAX(maximum[i], lmi[i]);
        }
    }
    free(parts);
    free(lmi);
    
    if (inform_failed(err))
    {
        if (allocate)
        {
            free(evidence);
        }
        return NULL;
    }

    return evidence;
}